

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t getShortestSubtagLength(char *localeID)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = strlen(localeID);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2 & 0xffffffff;
  }
  bVar1 = true;
  uVar5 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    if ((localeID[uVar3] == '-') || (localeID[uVar3] == '_')) {
      uVar6 = uVar2 & 0xffffffff;
      if ((int)uVar5 < (int32_t)uVar2) {
        uVar6 = (ulong)uVar5;
      }
      uVar2 = uVar2 & 0xffffffff;
      if (uVar5 != 0) {
        uVar2 = uVar6;
      }
      bVar1 = true;
    }
    else {
      uVar5 = uVar5 + 1;
      if (bVar1) {
        uVar5 = 1;
      }
      bVar1 = false;
    }
  }
  return (int32_t)uVar2;
}

Assistant:

static int32_t getShortestSubtagLength(const char *localeID) {
    int32_t localeIDLength = static_cast<int32_t>(uprv_strlen(localeID));
    int32_t length = localeIDLength;
    int32_t tmpLength = 0;
    int32_t i;
    UBool reset = TRUE;

    for (i = 0; i < localeIDLength; i++) {
        if (localeID[i] != '_' && localeID[i] != '-') {
            if (reset) {
                tmpLength = 0;
                reset = FALSE;
            }
            tmpLength++;
        } else {
            if (tmpLength != 0 && tmpLength < length) {
                length = tmpLength;
            }
            reset = TRUE;
        }
    }

    return length;
}